

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O3

void __thiscall
osc::ReceivedMessageArgument::AsBlob
          (ReceivedMessageArgument *this,void **data,osc_bundle_element_size_t *size)

{
  undefined8 *puVar1;
  pointer_____offset_0x10___ *ppuVar2;
  
  if (this->typeTagPtr_ == (char *)0x0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
    puVar1[1] = "missing argument";
    *puVar1 = &PTR__exception_00178c90;
    ppuVar2 = &MissingArgumentException::typeinfo;
  }
  else {
    if (*this->typeTagPtr_ == 'b') {
      AsBlobUnchecked(this,data,size);
      return;
    }
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
    puVar1[1] = "wrong argument type";
    *puVar1 = &PTR__exception_00178cb8;
    ppuVar2 = &WrongArgumentTypeException::typeinfo;
  }
  __cxa_throw(puVar1,ppuVar2,std::exception::~exception);
}

Assistant:

void ReceivedMessageArgument::AsBlob( const void*& data, osc_bundle_element_size_t& size ) const
{
    if( !typeTagPtr_ )
        throw MissingArgumentException();
	else if( *typeTagPtr_ == BLOB_TYPE_TAG )
		AsBlobUnchecked( data, size );
	else
		throw WrongArgumentTypeException();
}